

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,char (*u) [36])

{
  size_t size;
  
  size = strlen(*u);
  if ((char (*) [36])this->heap == u) {
    this->bufferSize = size;
  }
  else {
    resize(this,size);
    if (size != 0) {
      memcpy(this->heap,u,size);
    }
  }
  return this;
}

Assistant:

SmallBuffer& operator=(U&& u)
    {
        std::string_view val(std::forward<U>(u));
        if (reinterpret_cast<const std::byte*>(val.data()) == heap) {
            bufferSize = val.size();
            return *this;
        }
        resize(val.size());
        if (val.size() > 0) {
            std::memcpy(heap, val.data(), val.size());
        }
        return *this;
    }